

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  StringPtr local_30;
  ArrayPtr<const_char> local_20;
  
  local_20 = toCharSequence<char_const(&)[1]>((char (*) [1])*param_2);
  local_30.content.ptr = (char *)param_2[1];
  local_30.content.size_ = param_2[2] - 1;
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_20,(ArrayPtr<const_char> *)(param_2 + 3),&local_30,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}